

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Signal_PDU::Signal_PDU
          (Signal_PDU *this,EntityIdentifier *ID,KUINT16 RadioID,EncodingScheme *ES,
          KUINT32 SampleRate,KUINT16 Samples,KOCTET *Data,KUINT16 DataLength)

{
  KUINT16 Samples_local;
  KUINT32 SampleRate_local;
  EncodingScheme *ES_local;
  KUINT16 RadioID_local;
  EntityIdentifier *ID_local;
  Signal_PDU *this_local;
  
  Radio_Communications_Header::Radio_Communications_Header
            (&this->super_Radio_Communications_Header,ID,RadioID);
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Signal_PDU_00501ee0;
  DATA_TYPE::EncodingScheme::EncodingScheme(&this->m_EncodingScheme,ES);
  this->m_ui32SampleRate = SampleRate;
  this->m_ui16Samples = Samples;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_vData);
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x1a';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  SetData(this,Data,DataLength);
  return;
}

Assistant:

Signal_PDU::Signal_PDU( const EntityIdentifier & ID, KUINT16 RadioID, const EncodingScheme & ES,
                        KUINT32 SampleRate, KUINT16 Samples, const KOCTET * Data, KUINT16 DataLength ) :
    Radio_Communications_Header( ID, RadioID ),
    m_EncodingScheme( ES ),
    m_ui32SampleRate( SampleRate ),
    m_ui16Samples( Samples )
{
    m_ui8PDUType = Signal_PDU_Type;
    m_ui16PDULength = SIGNAL_PDU_SIZE;
    SetData( Data, DataLength );
}